

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall
Model_takeImportedComponentByName_Test::TestBody(Model_takeImportedComponentByName_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  AssertHelper local_d0 [8];
  Message local_c8 [8];
  unsigned_long local_c0 [2];
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  string local_98 [32];
  undefined1 local_78 [8];
  ComponentPtr takeComponent2;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  ComponentPtr takeComponent1;
  ModelPtr model;
  Model_takeImportedComponentByName_Test *this_local;
  
  commonSetupImportedComponent();
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&takeComponent1.
                          super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"myImportedComponent",&local_51);
  libcellml::ComponentEntity::takeComponent((string *)local_30,SUB81(peVar2,0));
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&takeComponent1.
                          super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"myConcreteComponent",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  libcellml::ComponentEntity::takeComponent((string *)local_78,SUB81(peVar2,0));
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  local_c0[1] = 0;
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &takeComponent1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_c0[0] = libcellml::ComponentEntity::componentCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_b0,"size_t(0)","model->componentCount()",local_c0 + 1,local_c0
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(local_c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x416,pcVar3);
    testing::internal::AssertHelper::operator=(local_d0,local_c8);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    testing::Message::~Message(local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_78);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_30);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &takeComponent1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(Model, takeImportedComponentByName)
{
    auto model = commonSetupImportedComponent();

    auto takeComponent1 = model->takeComponent("myImportedComponent");
    auto takeComponent2 = model->takeComponent("myConcreteComponent");

    EXPECT_EQ(size_t(0), model->componentCount());
}